

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall
ExtraData::parseCURRENCY
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  ostream *poVar1;
  longlong lVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  local_1c = pos;
  pvStack_18 = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST be a CURRENCY (Packet Version).");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"              Value:                ");
  poVar1 = std::operator<<((ostream *)&std::cout,"$ ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,val);
  lVar2 = Utils::vectEightBytesToUnsignedInt(&local_38,local_1c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)lVar2 / 10000.0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  return;
}

Assistant:

void ExtraData::parseCURRENCY(std::vector<unsigned int> val, int pos) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CURRENCY (Packet Version)." << endl;
    cout << "              Value:                ";
    cout << "$ " << (double)Utils::vectEightBytesToUnsignedInt(val, pos)/10000 << endl;
}